

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O3

int get_video_args(char **argv,int *w,int *h,int *bpp,Uint32 *flags)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  char *__s1;
  
  *w = 0x280;
  *h = 0x1e0;
  *bpp = 0;
  *flags = 0;
  __s1 = argv[1];
  if (__s1 == (char *)0x0) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    do {
      iVar1 = strcmp(__s1,"-width");
      if (iVar1 == 0) {
        if (argv[(long)iVar4 + 1] != (char *)0x0) {
          iVar1 = atoi(argv[(long)iVar4 + 1]);
          piVar3 = w;
LAB_001014aa:
          iVar4 = iVar4 + 1;
          *piVar3 = iVar1;
        }
      }
      else {
        iVar1 = strcmp(__s1,"-height");
        if (iVar1 == 0) {
          if (argv[(long)iVar4 + 1] != (char *)0x0) {
            iVar1 = atoi(argv[(long)iVar4 + 1]);
            piVar3 = h;
            goto LAB_001014aa;
          }
        }
        else {
          iVar1 = strcmp(__s1,"-bpp");
          if (iVar1 == 0) {
            if (argv[(long)iVar4 + 1] != (char *)0x0) {
              iVar1 = atoi(argv[(long)iVar4 + 1]);
              piVar3 = bpp;
              goto LAB_001014aa;
            }
          }
          else {
            iVar1 = strcmp(__s1,"-fullscreen");
            if (iVar1 == 0) {
              *(byte *)((long)flags + 3) = *(byte *)((long)flags + 3) | 0x80;
            }
            else {
              iVar1 = strcmp(__s1,"-hw");
              if (iVar1 == 0) {
                *(byte *)flags = (byte)*flags | 1;
              }
              else {
                iVar1 = strcmp(__s1,"-hwpalette");
                if (iVar1 != 0) {
                  return iVar4;
                }
                *(byte *)((long)flags + 3) = *(byte *)((long)flags + 3) | 0x20;
              }
            }
          }
        }
      }
      lVar2 = (long)iVar4;
      iVar4 = iVar4 + 1;
      __s1 = argv[lVar2 + 1];
    } while (__s1 != (char *)0x0);
  }
  return iVar4;
}

Assistant:

int get_video_args(char *argv[], int *w, int *h, int *bpp, Uint32 *flags)
{
	int i;

	*w = 640;
	*h = 480;
	*bpp = 0;
	*flags = SDL_SWSURFACE;

	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-width") == 0 ) {
			if ( argv[i+1] ) {
				*w = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-height") == 0 ) {
			if ( argv[i+1] ) {
				*h = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-bpp") == 0 ) {
			if ( argv[i+1] ) {
				*bpp = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			*flags |= SDL_FULLSCREEN;
		} else
		if ( strcmp(argv[i], "-hw") == 0 ) {
			*flags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[i], "-hwpalette") == 0 ) {
			*flags |= SDL_HWPALETTE;
		} else
			break;
	}
	return i;
}